

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O0

char * cJSONUtils_FindPointerFromObjectTo(cJSON *object,cJSON *target)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  uchar *full_pointer_1;
  uchar *full_pointer;
  uchar *target_pointer;
  cJSON *current_child;
  size_t child_index;
  cJSON *target_local;
  cJSON *object_local;
  
  current_child = (cJSON *)0x0;
  if ((object == (cJSON *)0x0) || (target == (cJSON *)0x0)) {
    object_local = (cJSON *)0x0;
  }
  else if (object == target) {
    object_local = (cJSON *)cJSONUtils_strdup("");
  }
  else {
    for (target_pointer = (uchar *)object->child; target_pointer != (uchar *)0x0;
        target_pointer = *(uchar **)target_pointer) {
      __s = cJSONUtils_FindPointerFromObjectTo((cJSON *)target_pointer,target);
      if (__s != (char *)0x0) {
        iVar1 = cJSON_IsArray(object);
        if (iVar1 != 0) {
          sVar2 = strlen(__s);
          pcVar3 = (char *)cJSON_malloc(sVar2 + 0x16);
          sprintf(pcVar3,"/%lu%s",current_child,__s);
          cJSON_free(__s);
          return pcVar3;
        }
        iVar1 = cJSON_IsObject(object);
        if (iVar1 != 0) {
          sVar2 = strlen(__s);
          sVar4 = pointer_encoded_length(*(uchar **)(target_pointer + 0x38));
          pcVar3 = (char *)cJSON_malloc(sVar2 + sVar4 + 2);
          *pcVar3 = '/';
          encode_string_as_pointer((uchar *)(pcVar3 + 1),*(uchar **)(target_pointer + 0x38));
          strcat(pcVar3,__s);
          cJSON_free(__s);
          return pcVar3;
        }
        cJSON_free(__s);
        return (char *)0x0;
      }
      current_child = (cJSON *)((long)&current_child->next + 1);
    }
    object_local = (cJSON *)0x0;
  }
  return (char *)object_local;
}

Assistant:

CJSON_PUBLIC(char *) cJSONUtils_FindPointerFromObjectTo(const cJSON * const object, const cJSON * const target)
{
    size_t child_index = 0;
    cJSON *current_child = 0;

    if ((object == NULL) || (target == NULL))
    {
        return NULL;
    }

    if (object == target)
    {
        /* found */
        return (char*)cJSONUtils_strdup((const unsigned char*)"");
    }

    /* recursively search all children of the object or array */
    for (current_child = object->child; current_child != NULL; (void)(current_child = current_child->next), child_index++)
    {
        unsigned char *target_pointer = (unsigned char*)cJSONUtils_FindPointerFromObjectTo(current_child, target);
        /* found the target? */
        if (target_pointer != NULL)
        {
            if (cJSON_IsArray(object))
            {
                /* reserve enough memory for a 64 bit integer + '/' and '\0' */
                unsigned char *full_pointer = (unsigned char*)cJSON_malloc(strlen((char*)target_pointer) + 20 + sizeof("/"));
                /* check if conversion to unsigned long is valid
                 * This should be eliminated at compile time by dead code elimination
                 * if size_t is an alias of unsigned long, or if it is bigger */
                if (child_index > ULONG_MAX)
                {
                    cJSON_free(target_pointer);
                    cJSON_free(full_pointer);
                    return NULL;
                }
                sprintf((char*)full_pointer, "/%lu%s", (unsigned long)child_index, target_pointer); /* /<array_index><path> */
                cJSON_free(target_pointer);

                return (char*)full_pointer;
            }

            if (cJSON_IsObject(object))
            {
                unsigned char *full_pointer = (unsigned char*)cJSON_malloc(strlen((char*)target_pointer) + pointer_encoded_length((unsigned char*)current_child->string) + 2);
                full_pointer[0] = '/';
                encode_string_as_pointer(full_pointer + 1, (unsigned char*)current_child->string);
                strcat((char*)full_pointer, (char*)target_pointer);
                cJSON_free(target_pointer);

                return (char*)full_pointer;
            }

            /* reached leaf of the tree, found nothing */
            cJSON_free(target_pointer);
            return NULL;
        }
    }

    /* not found */
    return NULL;
}